

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.cpp
# Opt level: O1

void __thiscall jsonChildren::doerase(jsonChildren *this,JSONNode **position,json_index_t number)

{
  ulong uVar1;
  
  uVar1 = (ulong)((long)position - (long)this->array) >> 3;
  if (position + number < this->array + this->mysize) {
    memmove(position,position + number,((ulong)this->mysize - (uVar1 + number)) * 8);
    uVar1 = (ulong)(this->mysize - number);
  }
  this->mysize = (json_index_t)uVar1;
  return;
}

Assistant:

void jsonChildren::doerase(JSONNode ** position, json_index_t number) json_nothrow {
    JSON_ASSERT(this != 0, JSON_TEXT("Children is null doerase"));
    JSON_ASSERT(array != 0, JSON_TEXT("erasing something from a null array 2"));
    JSON_ASSERT(position >= array, JSON_TEXT("position is beneath the start of the array 2"));
    JSON_ASSERT(position + number <= array + mysize, JSON_TEXT("erasing out of bounds 2"));
    if (position + number >= array + mysize){
	   mysize = (json_index_t)(position - array);
	   #ifndef JSON_ISO_STRICT
		  JSON_ASSERT((long long)position - (long long)array >= 0, JSON_TEXT("doing negative allocation"));
	   #endif
    } else {
	   std::memmove(position, position + number, (mysize - (position - array) - number) * sizeof(JSONNode *));
	   mysize -= number;
    }
}